

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

size_t __thiscall Common::analyzeMemory(Common *this,TaskHandle *head)

{
  size_t sVar1;
  bool bVar2;
  element_type *peVar3;
  reference pOVar4;
  unsigned_long *puVar5;
  __shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var6;
  element_type *peVar7;
  shared_ptr<Operand> *operand_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *__range2_2;
  OperandUsage *usage_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range2_1;
  OperandUsage *usage;
  iterator __end2;
  iterator __begin2;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range2;
  TaskHandle task;
  size_t peak_memory;
  shared_ptr<Operand> *operand_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
  *__range1_1;
  shared_ptr<Operand> *operand;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *__range1;
  size_t current_memory;
  TaskHandle *head_local;
  Common *this_local;
  
  analyzeTopology(this,head);
  __range1 = (vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *)0x0;
  __end1 = std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::begin
                     (&this->operands);
  operand = (shared_ptr<Operand> *)
            std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::end
                      (&this->operands);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
                                *)&operand);
    if (!bVar2) break;
    p_Var6 = (__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
             ::operator*(&__end1);
    peVar7 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Var6);
    peVar7->on_device = false;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
             ::begin(&this->already_on);
  operand_1 = (shared_ptr<Operand> *)
              std::
              set<std::shared_ptr<Operand>,_std::less<std::shared_ptr<Operand>_>,_std::allocator<std::shared_ptr<Operand>_>_>
              ::end(&this->already_on);
  while( true ) {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&operand_1);
    if (!bVar2) break;
    p_Var6 = (__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::_Rb_tree_const_iterator<std::shared_ptr<Operand>_>::operator*(&__end1_1);
    peVar7 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Var6);
    peVar7->on_device = true;
    peVar7 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (p_Var6);
    __range1 = (vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *)
               ((long)&(__range1->
                       super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + peVar7->size);
    std::_Rb_tree_const_iterator<std::shared_ptr<Operand>_>::operator++(&__end1_1);
  }
  task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__range1;
  std::shared_ptr<Task>::shared_ptr((shared_ptr<Task> *)&__range2,head);
  do {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range2);
    if (!bVar2) {
      std::shared_ptr<Task>::~shared_ptr((shared_ptr<Task> *)&__range2);
      return (size_t)task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
    peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &__range2);
    __end2 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin(&peVar3->ins);
    usage = (OperandUsage *)
            std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end(&peVar3->ins);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                                  *)&usage);
      if (!bVar2) break;
      pOVar4 = __gnu_cxx::
               __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
               ::operator*(&__end2);
      peVar7 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          pOVar4);
      if ((peVar7->on_device & 1U) == 0) {
        __assert_fail("usage.operand->on_device",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/LyricZhao[P]DLMO/schedule.hpp"
                      ,0x212,"size_t Common::analyzeMemory(TaskHandle &) const");
      }
      __gnu_cxx::
      __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>::
      operator++(&__end2);
    }
    peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &__range2);
    __end2_1 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin(&peVar3->outs);
    usage_1 = (OperandUsage *)
              std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end(&peVar3->outs);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                          *)&usage_1);
      if (!bVar2) break;
      pOVar4 = __gnu_cxx::
               __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
               ::operator*(&__end2_1);
      peVar7 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          pOVar4);
      if ((peVar7->on_device & 1U) == 0) {
        peVar7 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)pOVar4);
        peVar7->on_device = true;
        peVar7 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)pOVar4);
        __range1 = (vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *)
                   ((long)&(__range1->
                           super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + peVar7->size);
      }
      __gnu_cxx::
      __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>::
      operator++(&__end2_1);
    }
    peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &__range2);
    sVar1 = peVar3->workspace;
    peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &__range2);
    peVar3->execution_memory =
         (long)&(__range1->
                super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>
                )._M_impl.super__Vector_impl_data._M_start + sVar1;
    peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &__range2);
    puVar5 = std::max<unsigned_long>
                       ((unsigned_long *)
                        &task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                        &peVar3->execution_memory);
    task.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar5;
    peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &__range2);
    __end2_2 = std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::
               begin(&peVar3->to_dealloc_after);
    operand_2 = (shared_ptr<Operand> *)
                std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>::
                end(&peVar3->to_dealloc_after);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_2,
                         (__normal_iterator<std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
                          *)&operand_2);
      if (!bVar2) break;
      p_Var6 = (__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
               ::operator*(&__end2_2);
      peVar7 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var6);
      peVar7->on_device = false;
      peVar7 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var6);
      __range1 = (vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *)
                 ((long)__range1 - peVar7->size);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Operand>_*,_std::vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>_>
      ::operator++(&__end2_2);
    }
    peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &__range2);
    std::shared_ptr<Task>::operator=((shared_ptr<Task> *)&__range2,&peVar3->next);
  } while( true );
}

Assistant:

size_t analyzeMemory(TaskHandle &head) const {
        // Analyze topology
        analyzeTopology(head);

        // Operands already on device
        size_t current_memory = 0;
        for (auto &operand: operands) {
            operand->on_device = false;
        }
        for (auto &operand: already_on) {
            operand->on_device = true;
            current_memory += operand->size;
        }
        size_t peak_memory = current_memory;

        // Loop all tasks
        LOOP(task, head) {
            for (auto &usage: task->ins) {
                assert(usage.operand->on_device);
            }
            for (auto &usage: task->outs) {
                if (not usage.operand->on_device) {
                    usage.operand->on_device = true;
                    current_memory += usage.operand->size;
                }
            }
            task->execution_memory = current_memory + task->workspace;
            peak_memory = std::max(peak_memory, task->execution_memory);

            for (auto &operand: task->to_dealloc_after) {
                operand->on_device = false;
                current_memory -= operand->size;
            }
        }
        return peak_memory;
    }